

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

void setarrayvector(lua_State *L,Table *t,uint size)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  TValue *pTVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  
  pTVar5 = (TValue *)luaM_realloc_(L,t->array,(ulong)t->sizearray << 4,(ulong)size << 4);
  t->array = pTVar5;
  auVar4 = _DAT_00121020;
  auVar3 = _DAT_00121010;
  auVar2 = _DAT_00121000;
  uVar1 = t->sizearray;
  if (uVar1 < size) {
    lVar8 = (ulong)size - (ulong)uVar1;
    lVar9 = lVar8 + -1;
    auVar10._8_4_ = (int)lVar9;
    auVar10._0_8_ = lVar9;
    auVar10._12_4_ = (int)((ulong)lVar9 >> 0x20);
    piVar6 = &pTVar5[(ulong)uVar1 + 3].tt_;
    uVar7 = 0;
    auVar10 = auVar10 ^ _DAT_00121020;
    do {
      auVar12._8_4_ = (int)uVar7;
      auVar12._0_8_ = uVar7;
      auVar12._12_4_ = (int)(uVar7 >> 0x20);
      auVar13 = (auVar12 | auVar3) ^ auVar4;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                  iVar11 < auVar13._4_4_) & 1)) {
        piVar6[-0xc] = 0;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        piVar6[-8] = 0;
      }
      auVar12 = (auVar12 | auVar2) ^ auVar4;
      iVar14 = auVar12._4_4_;
      if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar12._0_4_ <= auVar10._0_4_)) {
        piVar6[-4] = 0;
        *piVar6 = 0;
      }
      uVar7 = uVar7 + 4;
      piVar6 = piVar6 + 0x10;
    } while ((lVar8 + 3U & 0xfffffffffffffffc) != uVar7);
  }
  t->sizearray = size;
  return;
}

Assistant:

static void setarrayvector (lua_State *L, Table *t, unsigned int size) {
  unsigned int i;
  luaM_reallocvector(L, t->array, t->sizearray, size, TValue);
  for (i=t->sizearray; i<size; i++)
     setnilvalue(&t->array[i]);
  t->sizearray = size;
}